

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep_context.cc
# Opt level: O2

void __thiscall p2t::SweepContext::~SweepContext(SweepContext *this)

{
  list<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_> *this_00;
  Point *pPVar1;
  AdvancingFront *this_01;
  pointer ppEVar2;
  uint uVar3;
  _List_node_base *p_Var4;
  
  pPVar1 = this->head_;
  if (pPVar1 != (Point *)0x0) {
    std::_Vector_base<p2t::Edge_*,_std::allocator<p2t::Edge_*>_>::~_Vector_base
              (&(pPVar1->edge_list).super__Vector_base<p2t::Edge_*,_std::allocator<p2t::Edge_*>_>);
  }
  operator_delete(pPVar1);
  pPVar1 = this->tail_;
  if (pPVar1 != (Point *)0x0) {
    std::_Vector_base<p2t::Edge_*,_std::allocator<p2t::Edge_*>_>::~_Vector_base
              (&(pPVar1->edge_list).super__Vector_base<p2t::Edge_*,_std::allocator<p2t::Edge_*>_>);
  }
  operator_delete(pPVar1);
  this_01 = this->front_;
  if (this_01 != (AdvancingFront *)0x0) {
    AdvancingFront::~AdvancingFront(this_01);
  }
  operator_delete(this_01);
  operator_delete(this->af_head_);
  operator_delete(this->af_middle_);
  operator_delete(this->af_tail_);
  this_00 = &this->map_;
  p_Var4 = (_List_node_base *)this_00;
  while (p_Var4 = (((_List_base<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_> *)
                   &p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var4 != (_List_node_base *)this_00) {
    operator_delete(p_Var4[1]._M_next);
  }
  uVar3 = 0;
  while( true ) {
    ppEVar2 = (this->edge_list).super__Vector_base<p2t::Edge_*,_std::allocator<p2t::Edge_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->edge_list).
                      super__Vector_base<p2t::Edge_*,_std::allocator<p2t::Edge_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppEVar2 >> 3) <= (ulong)uVar3)
    break;
    operator_delete(ppEVar2[uVar3]);
    uVar3 = uVar3 + 1;
  }
  std::_Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>::~_Vector_base
            (&(this->points_).super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>);
  std::__cxx11::_List_base<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_>::_M_clear
            (&this_00->super__List_base<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_>);
  std::_Vector_base<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_>::~_Vector_base
            (&(this->triangles_).
              super__Vector_base<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_>);
  std::_Vector_base<p2t::Edge_*,_std::allocator<p2t::Edge_*>_>::~_Vector_base
            ((_Vector_base<p2t::Edge_*,_std::allocator<p2t::Edge_*>_> *)this);
  return;
}

Assistant:

SweepContext::~SweepContext()
{

    // Clean up memory

    delete head_;
    delete tail_;
    delete front_;
    delete af_head_;
    delete af_middle_;
    delete af_tail_;

    typedef std::list<Triangle*> type_list;

    for(type_list::iterator iter = map_.begin(); iter != map_.end(); ++iter) {
        Triangle* ptr = *iter;
        delete ptr;
    }

     for(unsigned int i = 0; i < edge_list.size(); i++) {
        delete edge_list[i];
    }

}